

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::print(Statistics *this,ostream *os)

{
  long lVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  long local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgDualDegeneracy;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  avgPrimalDegeneracy;
  
  (*this->solvingTime->_vptr_Timer[6])();
  dVar2 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (*this->readingTime->_vptr_Timer[6])();
  (*this->syncTime->_vptr_Timer[6])();
  (*this->transformTime->_vptr_Timer[6])();
  (*this->preprocessingTime->_vptr_Timer[6])();
  (*this->simplexTime->_vptr_Timer[6])();
  (*this->rationalTime->_vptr_Timer[6])();
  if ((long)this->iterationsPrimal < 1) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&avgPrimalDegeneracy.m_backend,0.0,(type *)0x0);
  }
  else {
    avgPrimalDegeneracy.m_backend.fpclass = cpp_dec_float_finite;
    avgPrimalDegeneracy.m_backend.prec_elem = 10;
    avgPrimalDegeneracy.m_backend.data._M_elems[0] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[1] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[2] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[3] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[4] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[5] = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems._24_5_ = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems[7]._1_3_ = 0;
    avgPrimalDegeneracy.m_backend.data._M_elems._32_5_ = 0;
    avgPrimalDegeneracy.m_backend._37_8_ = 0;
    avgDualDegeneracy.m_backend.data._M_elems._0_8_ = (long)this->iterationsPrimal;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&avgPrimalDegeneracy.m_backend,&(this->sumPrimalDegen).m_backend,
               (longlong *)&avgDualDegeneracy);
  }
  iVar4 = this->iterations - this->iterationsPrimal;
  if (iVar4 == 0 || this->iterations < this->iterationsPrimal) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&avgDualDegeneracy.m_backend,0.0,(type *)0x0);
  }
  else {
    avgDualDegeneracy.m_backend.fpclass = cpp_dec_float_finite;
    avgDualDegeneracy.m_backend.prec_elem = 10;
    avgDualDegeneracy.m_backend.data._M_elems[0] = 0;
    avgDualDegeneracy.m_backend.data._M_elems[1] = 0;
    avgDualDegeneracy.m_backend.data._M_elems[2] = 0;
    avgDualDegeneracy.m_backend.data._M_elems[3] = 0;
    avgDualDegeneracy.m_backend.data._M_elems[4] = 0;
    avgDualDegeneracy.m_backend.data._M_elems[5] = 0;
    avgDualDegeneracy.m_backend.data._M_elems._24_5_ = 0;
    avgDualDegeneracy.m_backend.data._M_elems[7]._1_3_ = 0;
    avgDualDegeneracy.m_backend.data._M_elems._32_5_ = 0;
    avgDualDegeneracy.m_backend._37_8_ = 0;
    local_b0 = (long)iVar4;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&avgDualDegeneracy.m_backend,&(this->sumDualDegen).m_backend,&local_b0);
  }
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 4;
  std::operator<<(os,"Total time          : ");
  poVar5 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) + dVar2);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Reading           : ");
  (*this->readingTime->_vptr_Timer[6])();
  poVar5 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Solving           : ");
  poVar5 = std::ostream::_M_insert<double>(dVar2);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Preprocessing     : ");
  (*this->preprocessingTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
  if (dVar2 <= 0.0) {
    std::operator<<(os,"\n  Simplex           : ");
    (*this->simplexTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
  }
  else {
    std::operator<<(os," (");
    (*this->preprocessingTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08) / dVar2) * 100.0)
    ;
    std::operator<<(poVar5,"% of solving time)");
    std::operator<<(os,"\n  Simplex           : ");
    (*this->simplexTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
    std::operator<<(os," (");
    (*this->simplexTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10) / dVar2) * 100.0)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  std::operator<<(os,"\n  Synchronization   : ");
  (*this->syncTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
  if (dVar2 <= 0.0) {
    std::operator<<(os,"\n  Transformation    : ");
    (*this->transformTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
  }
  else {
    std::operator<<(os," (");
    (*this->syncTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13) / dVar2) * 100.0)
    ;
    std::operator<<(poVar5,"% of solving time)");
    std::operator<<(os,"\n  Transformation    : ");
    (*this->transformTime->_vptr_Timer[6])();
    std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
    std::operator<<(os," (");
    (*this->transformTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15) * 100.0) / dVar2)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  std::operator<<(os,"\n  Rational          : ");
  (*this->rationalTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    (*this->rationalTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18) * 100.0) / dVar2)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  std::operator<<(os,"\n  InitialPrecision  : ");
  (*this->initialPrecisionTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    (*this->initialPrecisionTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20) * 100.0) / dVar2)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  std::operator<<(os,"\n  ExtendedPrecision : ");
  (*this->extendedPrecisionTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    (*this->extendedPrecisionTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22) * 100.0) / dVar2)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  std::operator<<(os,"\n  BoostingStep      : ");
  (*this->boostingStepTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    (*this->boostingStepTime->_vptr_Timer[6])();
    poVar5 = std::ostream::_M_insert<double>
                       (((double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24) * 100.0) / dVar2)
    ;
    std::operator<<(poVar5,"% of solving time)");
  }
  dVar3 = ((((dVar2 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) -
            (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02)) -
           (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03)) -
          (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04)) -
          (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
  std::operator<<(os,"\n  FpTime            : ");
  std::ostream::_M_insert<double>(this->fpTime);
  if (dVar2 <= 0.0) {
    std::operator<<(os,"\n  Other             : ");
    std::ostream::_M_insert<double>(dVar3);
  }
  else {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((this->fpTime * 100.0) / dVar2);
    std::operator<<(poVar5,"% of solving time)");
    std::operator<<(os,"\n  Other             : ");
    std::ostream::_M_insert<double>(dVar3);
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((dVar3 * 100.0) / dVar2);
    std::operator<<(poVar5,"% of solving time)");
  }
  poVar5 = std::operator<<(os,"\nRefinements         : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->refinements);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Stalling          : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->stallRefinements);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Pivoting          : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->pivotRefinements);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Feasibility       : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->feasRefinements);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Unboundedness     : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->unbdRefinements);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"Precision boosts    : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->precBoosts);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Stalling          : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->stallPrecBoosts);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Pivoting          : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->pivotPrecBoosts);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Feasibility       : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->feasPrecBoosts);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  Unboundedness     : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->unbdPrecBoosts);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"Iterations          : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->iterations);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  From scratch      : ");
  std::ostream::operator<<((ostream *)poVar5,this->iterations - this->iterationsFromBasis);
  if (0 < this->iterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)(this->iterations - this->iterationsFromBasis) * 100.0) /
                        (double)this->iterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  From basis        : ");
  std::ostream::operator<<((ostream *)poVar5,this->iterationsFromBasis);
  if (0 < this->iterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)this->iterationsFromBasis * 100.0) / (double)this->iterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Primal            : ");
  std::ostream::operator<<((ostream *)poVar5,this->iterationsPrimal);
  if (0 < this->iterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)this->iterationsPrimal * 100.0) / (double)this->iterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Dual              : ");
  std::ostream::operator<<
            ((ostream *)poVar5,this->iterations - (this->iterationsPrimal + this->iterationsPolish))
  ;
  if (0 < this->iterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)(this->iterations - this->iterationsPrimal) * 100.0) /
                        (double)this->iterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Bound flips       : ");
  std::ostream::operator<<((ostream *)poVar5,this->boundflips);
  poVar5 = std::operator<<(os,"\n  Sol. polishing    : ");
  std::ostream::operator<<((ostream *)poVar5,this->iterationsPolish);
  poVar5 = std::operator<<(os,"\n  First FP solve    : ");
  std::ostream::operator<<((ostream *)poVar5,this->iterationsFP);
  poVar5 = std::operator<<(os,"\nIterationsBoosted   : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->boostedIterations);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"  From scratch      : ");
  std::ostream::operator<<
            ((ostream *)poVar5,this->boostedIterations - this->boostedIterationsFromBasis);
  if (0 < this->boostedIterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)(this->boostedIterations - this->boostedIterationsFromBasis) *
                        100.0) / (double)this->boostedIterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  From basis        : ");
  std::ostream::operator<<((ostream *)poVar5,this->boostedIterationsFromBasis);
  if (0 < this->boostedIterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)this->boostedIterationsFromBasis * 100.0) /
                        (double)this->boostedIterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Primal            : ");
  std::ostream::operator<<((ostream *)poVar5,this->boostedIterationsPrimal);
  if (0 < this->boostedIterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)this->boostedIterationsPrimal * 100.0) /
                        (double)this->boostedIterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Dual              : ");
  std::ostream::operator<<
            ((ostream *)poVar5,
             this->boostedIterations -
             (this->boostedIterationsPrimal + this->boostedIterationsPolish));
  if (0 < this->boostedIterations) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>
                       (((double)(this->boostedIterations - this->boostedIterationsPrimal) * 100.0)
                        / (double)this->boostedIterations);
    std::operator<<(poVar5,"%)");
  }
  poVar5 = std::operator<<(os,"\n  Bound flips       : ");
  std::ostream::operator<<((ostream *)poVar5,this->boostedBoundflips);
  poVar5 = std::operator<<(os,"\n  Sol. polishing    : ");
  std::ostream::operator<<((ostream *)poVar5,this->boostedIterationsPolish);
  poVar5 = std::operator<<(os,"\nLU factorizations   : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->luFactorizationsReal);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Factor. frequency : ");
  if (this->luFactorizationsReal < 1) {
    pcVar6 = "-\n";
    poVar5 = os;
  }
  else {
    poVar5 = std::ostream::_M_insert<double>
                       ((double)this->iterations / (double)this->luFactorizationsReal);
    pcVar6 = " iterations per factorization\n";
  }
  std::operator<<(poVar5,pcVar6);
  std::operator<<(os,"  Factor. time      : ");
  poVar5 = std::ostream::_M_insert<double>(this->luFactorizationTimeReal);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"LU solves           : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->luSolvesReal);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Solve frequency   : ");
  if (this->iterations < 1) {
    pcVar6 = "-\n";
    poVar5 = os;
  }
  else {
    poVar5 = std::ostream::_M_insert<double>((double)this->luSolvesReal / (double)this->iterations);
    pcVar6 = " solves per iteration\n";
  }
  std::operator<<(poVar5,pcVar6);
  std::operator<<(os,"  Solve time        : ");
  poVar5 = std::ostream::_M_insert<double>(this->luSolveTimeReal);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"Matrix-Vector ops   : \n");
  std::operator<<(poVar5,"  Sparse    time    : ");
  std::ostream::_M_insert<double>(this->multTimeSparse);
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((this->multTimeSparse / dVar2) * 100.0);
    std::operator<<(poVar5,"% of solving time)");
  }
  poVar5 = std::operator<<(os,"\n            calls   : ");
  std::ostream::operator<<((ostream *)poVar5,this->multSparseCalls);
  std::operator<<(os," (");
  poVar5 = std::ostream::_M_insert<double>
                     (((double)this->multSparseCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::operator<<(poVar5,"% of iterations)");
  std::operator<<(os,"\n  Full      time    : ");
  std::ostream::_M_insert<double>(this->multTimeFull);
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((this->multTimeFull / dVar2) * 100.0);
    std::operator<<(poVar5,"% of solving time)");
  }
  poVar5 = std::operator<<(os,"\n            calls   : ");
  std::ostream::operator<<((ostream *)poVar5,this->multFullCalls);
  std::operator<<(os," (");
  poVar5 = std::ostream::_M_insert<double>
                     (((double)this->multFullCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::operator<<(poVar5,"% of iterations)");
  std::operator<<(os,"\n  Colwise   time    : ");
  std::ostream::_M_insert<double>(this->multTimeColwise);
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((this->multTimeColwise / dVar2) * 100.0);
    std::operator<<(poVar5,"% of solving time)");
  }
  poVar5 = std::operator<<(os,"\n            calls   : ");
  std::ostream::operator<<((ostream *)poVar5,this->multColwiseCalls);
  std::operator<<(os," (");
  poVar5 = std::ostream::_M_insert<double>
                     (((double)this->multColwiseCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::operator<<(poVar5,"% of iterations)");
  std::operator<<(os,"\n  Unsetup   time    : ");
  std::ostream::_M_insert<double>(this->multTimeUnsetup);
  if (0.0 < dVar2) {
    std::operator<<(os," (");
    poVar5 = std::ostream::_M_insert<double>((this->multTimeUnsetup / dVar2) * 100.0);
    std::operator<<(poVar5,"% of solving time)");
  }
  poVar5 = std::operator<<(os,"\n            calls   : ");
  std::ostream::operator<<((ostream *)poVar5,this->multUnsetupCalls);
  std::operator<<(os," (");
  poVar5 = std::ostream::_M_insert<double>
                     (((double)this->multUnsetupCalls / ((double)this->iterations + 0.01)) * 100.0);
  std::operator<<(poVar5,"% of iterations)");
  std::operator<<(os,"\n");
  poVar5 = std::operator<<(os,"Rat. factorizations : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->luFactorizationsRational);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Rat. factor. time : ");
  poVar5 = std::ostream::_M_insert<double>(this->luFactorizationTimeRational);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Rat. solve time   : ");
  poVar5 = std::ostream::_M_insert<double>(this->luSolveTimeRational);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"Rat. reconstructions: ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->rationalReconstructions);
  poVar5 = std::operator<<(poVar5,"\n");
  std::operator<<(poVar5,"  Rat. rec. time    : ");
  (*this->reconstructionTime->_vptr_Timer[6])();
  poVar5 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_25,extraout_XMM0_Da_25));
  std::operator<<(poVar5,"\n");
  std::operator<<(os,"Degeneracy          : \n");
  poVar5 = std::operator<<(os,"  Primal Pivots     : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->degenPivotsPrimal);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"  Dual Pivots       : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->degenPivotsDual);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"  Primal Candidates : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->degenPivotCandPrimal);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"  Dual Candidates   : ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->degenPivotCandDual);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"  Average Primal    : ");
  poVar5 = boost::multiprecision::operator<<(poVar5,&avgPrimalDegeneracy);
  std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(os,"  Average Dual      : ");
  poVar5 = boost::multiprecision::operator<<(poVar5,&avgDualDegeneracy);
  std::operator<<(poVar5,"\n");
  if (0 < this->iterationsInit) {
    poVar5 = std::operator<<(os,"Algorithm Iterations: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->callsReducedProb);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"  Total             : ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar5,this->iterationsRedProb + this->iterationsInit);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"  Initial           : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->iterationsInit);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"  Reduced Problem   : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->iterationsRedProb);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"  Comp. Problem     : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->iterationsCompProb);
    std::operator<<(poVar5,"\n");
    std::operator<<(os,"Red. Problem Size   : \n");
    poVar5 = std::operator<<(os,"  Rows              : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->numRedProbRows);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"  Columns           : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->numRedProbCols);
    std::operator<<(poVar5,"\n");
    lVar1 = *(long *)os;
    *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 0x10;
    *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 2;
    *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    poVar5 = std::operator<<(os,"Red. Problem Status : ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->redProbStatus);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(os,"Comp. Problem Status: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,this->compProbStatus);
    std::operator<<(poVar5,"\n");
    lVar1 = *(long *)os;
    *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 0x10;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
    poVar5 = std::operator<<(os,"Comp. Problem Obj.  : ");
    poVar5 = boost::multiprecision::operator<<(poVar5,&this->finalCompObj);
    std::operator<<(poVar5,"\n");
  }
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
  std::operator<<(os,"Numerics            :\n");
  poVar5 = std::operator<<(os,"  Condition Number  : ");
  poVar5 = boost::multiprecision::operator<<(poVar5,&this->finalBasisCondition);
  std::operator<<(poVar5,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::print(std::ostream& os)
{
   Real solTime = solvingTime->time();
   Real totTime = readingTime->time() + solTime;
   Real otherTime = solTime - syncTime->time() - transformTime->time() - preprocessingTime->time() -
                    simplexTime->time() - rationalTime->time();

   R avgPrimalDegeneracy = iterationsPrimal > 0 ? sumPrimalDegen / iterationsPrimal : 0.0;
   R avgDualDegeneracy = (iterations - iterationsPrimal) > 0 ?
                         (sumDualDegen / (iterations - iterationsPrimal)) : 0.0;

   SPxOut::setFixed(os, 2);

   os << "Total time          : " << totTime << "\n"
      << "  Reading           : " << readingTime->time() << "\n"
      << "  Solving           : " << solTime << "\n"
      << "  Preprocessing     : " << preprocessingTime->time();

   if(solTime > 0)
      os << " (" << 100 * (preprocessingTime->time() / solTime) << "% of solving time)";

   os << "\n  Simplex           : " << simplexTime->time();

   if(solTime > 0)
      os << " (" << 100 * (simplexTime->time() / solTime) << "% of solving time)";

   os << "\n  Synchronization   : " << syncTime->time();

   if(solTime > 0)
      os << " (" << 100 * (syncTime->time() / solTime) << "% of solving time)";

   os << "\n  Transformation    : " << transformTime->time();

   if(solTime > 0)
      os << " (" << 100 * transformTime->time() / solTime << "% of solving time)";

   os << "\n  Rational          : " << rationalTime->time();

   if(solTime > 0)
      os << " (" << 100 * rationalTime->time() / solTime << "% of solving time)";

   os << "\n  InitialPrecision  : " << initialPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * initialPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  ExtendedPrecision : " << extendedPrecisionTime->time();

   if(solTime > 0)
      os << " (" << 100 * extendedPrecisionTime->time() / solTime << "% of solving time)";

   os << "\n  BoostingStep      : " << boostingStepTime->time();

   if(solTime > 0)
      os << " (" << 100 * boostingStepTime->time() / solTime << "% of solving time)";

   os << "\n  FpTime            : " << fpTime;

   if(solTime > 0)
      os << " (" << 100 * fpTime / solTime << "% of solving time)";

   os << "\n  Other             : " << otherTime;

   if(solTime > 0)
      os << " (" << 100 * otherTime / solTime << "% of solving time)";

   os << "\nRefinements         : " << refinements << "\n"
      << "  Stalling          : " << stallRefinements << "\n"
      << "  Pivoting          : " << pivotRefinements << "\n"
      << "  Feasibility       : " << feasRefinements << "\n"
      << "  Unboundedness     : " << unbdRefinements << "\n";

   os << "Precision boosts    : " << precBoosts << "\n"
      << "  Stalling          : " << stallPrecBoosts << "\n"
      << "  Pivoting          : " << pivotPrecBoosts << "\n"
      << "  Feasibility       : " << feasPrecBoosts << "\n"
      << "  Unboundedness     : " << unbdPrecBoosts << "\n";

   os << "Iterations          : " << iterations << "\n"
      << "  From scratch      : " << iterations - iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsFromBasis)) / double(iterations) << "%)";

   os << "\n  From basis        : " << iterationsFromBasis;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsFromBasis) / double(iterations) << "%)";

   os << "\n  Primal            : " << iterationsPrimal;

   if(iterations > 0)
      os << " (" << 100 * double(iterationsPrimal) / double(iterations) << "%)";

   os << "\n  Dual              : " << iterations - iterationsPrimal - iterationsPolish;

   if(iterations > 0)
      os << " (" << 100 * double((iterations - iterationsPrimal)) / double(iterations) << "%)";

   os << "\n  Bound flips       : " << boundflips;
   os << "\n  Sol. polishing    : " << iterationsPolish;
   os << "\n  First FP solve    : " << iterationsFP;

   os << "\nIterationsBoosted   : " << boostedIterations << "\n"
      << "  From scratch      : " << int(boostedIterations - boostedIterationsFromBasis);

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsFromBasis)) / double(
            boostedIterations) << "%)";

   os << "\n  From basis        : " << boostedIterationsFromBasis;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsFromBasis) / double(boostedIterations) << "%)";

   os << "\n  Primal            : " << boostedIterationsPrimal;

   if(boostedIterations > 0)
      os << " (" << 100 * double(boostedIterationsPrimal) / double(boostedIterations) << "%)";

   os << "\n  Dual              : " << boostedIterations - boostedIterationsPrimal -
      boostedIterationsPolish;

   if(boostedIterations > 0)
      os << " (" << 100 * double((boostedIterations - boostedIterationsPrimal)) / double(
            boostedIterations) << "%)";

   os << "\n  Bound flips       : " << boostedBoundflips;
   os << "\n  Sol. polishing    : " << boostedIterationsPolish;

   os << "\nLU factorizations   : " << luFactorizationsReal << "\n"
      << "  Factor. frequency : ";

   if(luFactorizationsReal > 0)
      os << double(iterations) / double(luFactorizationsReal) << " iterations per factorization\n";
   else
      os << "-\n";

   os << "  Factor. time      : " << luFactorizationTimeReal << "\n";

   os << "LU solves           : " << luSolvesReal << "\n"
      << "  Solve frequency   : ";

   if(iterations > 0)
      os << double(luSolvesReal) / double(iterations) << " solves per iteration\n";
   else
      os << "-\n";

   os << "  Solve time        : " << luSolveTimeReal << "\n";

   os << "Matrix-Vector ops   : \n"
      << "  Sparse    time    : " << multTimeSparse;

   if(solTime > 0)
      os << " (" << 100 * (multTimeSparse / solTime) << "% of solving time)";

   os << "\n            calls   : " << multSparseCalls;
   os << " (" << 100 * (multSparseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Full      time    : " << multTimeFull;

   if(solTime > 0)
      os << " (" << 100 * (multTimeFull / solTime) << "% of solving time)";

   os << "\n            calls   : " << multFullCalls;
   os << " (" << 100 * (multFullCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Colwise   time    : " << multTimeColwise;

   if(solTime > 0)
      os << " (" << 100 * (multTimeColwise / solTime) << "% of solving time)";

   os << "\n            calls   : " << multColwiseCalls;
   os << " (" << 100 * (multColwiseCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n  Unsetup   time    : " << multTimeUnsetup;

   if(solTime > 0)
      os << " (" << 100 * (multTimeUnsetup / solTime) << "% of solving time)";

   os << "\n            calls   : " << multUnsetupCalls;
   os << " (" << 100 * (multUnsetupCalls / (0.01 + iterations)) << "% of iterations)";
   os << "\n";

   os << "Rat. factorizations : " << luFactorizationsRational << "\n"
      << "  Rat. factor. time : " << luFactorizationTimeRational << "\n"
      << "  Rat. solve time   : " << luSolveTimeRational << "\n";

   os << "Rat. reconstructions: " << rationalReconstructions << "\n"
      << "  Rat. rec. time    : " << reconstructionTime->time() << "\n";

   os << "Degeneracy          : \n";
   os << "  Primal Pivots     : " << degenPivotsPrimal << "\n";
   os << "  Dual Pivots       : " << degenPivotsDual << "\n";
   os << "  Primal Candidates : " << degenPivotCandPrimal << "\n";
   os << "  Dual Candidates   : " << degenPivotCandDual << "\n";
   os << "  Average Primal    : " << avgPrimalDegeneracy << "\n";
   os << "  Average Dual      : " << avgDualDegeneracy << "\n";

   if(iterationsInit > 0)
   {
      os << "Algorithm Iterations: " << callsReducedProb << "\n";
      os << "  Total             : " << iterationsInit + iterationsRedProb << "\n";
      os << "  Initial           : " << iterationsInit << "\n";
      os << "  Reduced Problem   : " << iterationsRedProb << "\n";
      os << "  Comp. Problem     : " << iterationsCompProb << "\n";
      os << "Red. Problem Size   : \n";
      os << "  Rows              : " << numRedProbRows << "\n";
      os << "  Columns           : " << numRedProbCols << "\n";

      SPxOut::setScientific(os, 16);

      SPxOut::setFixed(os, 2);

      os << "Red. Problem Status : " << redProbStatus << "\n";
      os << "Comp. Problem Status: " << compProbStatus << "\n";

      SPxOut::setScientific(os, 16);

      os << "Comp. Problem Obj.  : " << finalCompObj << "\n";
   }

   SPxOut::setScientific(os);

   os << "Numerics            :\n";
   os << "  Condition Number  : " << finalBasisCondition << "\n";

}